

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rw_socket.cpp
# Opt level: O2

void __thiscall cppnet::RWSocket::AddTimer(RWSocket *this,uint32_t interval,bool always)

{
  uint32_t uVar1;
  shared_ptr<cppnet::Dispatcher> dispatcher;
  shared_ptr<cppnet::RWSocket> local_40;
  __shared_ptr<cppnet::Dispatcher,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  if (this->_timer_id == 0) {
    std::__shared_ptr<cppnet::Dispatcher,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_30,&(this->super_Socket)._dispatcher);
    if (local_30._M_ptr != (Dispatcher *)0x0) {
      std::__shared_ptr<cppnet::RWSocket,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<cppnet::RWSocket,void>
                ((__shared_ptr<cppnet::RWSocket,(__gnu_cxx::_Lock_policy)2> *)&local_40,
                 (__weak_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2> *)
                 &this->super_enable_shared_from_this<cppnet::RWSocket>);
      uVar1 = Dispatcher::AddTimer(local_30._M_ptr,&local_40,interval,always);
      this->_timer_id = uVar1;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_40.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  }
  return;
}

Assistant:

void RWSocket::AddTimer(uint32_t interval, bool always) {
    if (_timer_id > 0) {
        return;
    }
    
    auto dispatcher = GetDispatcher();
    if (dispatcher) {
        _timer_id = dispatcher->AddTimer(shared_from_this(), interval, always);
    }
}